

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseOption
          (Parser *this,Message *options,LocationRecorder *options_location,
          FileDescriptorProto *containing_file,OptionStyle style)

{
  FileDescriptorProto *parent;
  bool bVar1;
  int iVar2;
  int path2;
  Descriptor *this_00;
  FieldDescriptor *pFVar3;
  LogMessage *pLVar4;
  long *plVar5;
  Message *f;
  UninterpretedOption *this_01;
  Token *pTVar6;
  string *value_00;
  double local_328;
  allocator local_259;
  string local_258;
  undefined1 local_238 [8];
  string value_3;
  string local_210;
  double local_1f0;
  double value_2;
  uint64 max_value;
  uint64 value_1;
  string value;
  string local_1b0;
  allocator local_189;
  string local_188;
  LogFinisher local_161;
  LogMessage local_160;
  byte local_121;
  undefined1 local_120 [7];
  bool is_negative;
  LocationRecorder value_location;
  LocationRecorder part_location_1;
  LocationRecorder part_location;
  LocationRecorder name_location;
  UninterpretedOption *uninterpreted_option;
  undefined1 local_d0 [8];
  LocationRecorder location;
  Reflection *reflection;
  LogMessage local_b0;
  allocator local_61;
  string local_60;
  FieldDescriptor *local_40;
  FieldDescriptor *uninterpreted_option_field;
  FileDescriptorProto *pFStack_30;
  OptionStyle style_local;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *options_location_local;
  Message *options_local;
  Parser *this_local;
  
  uninterpreted_option_field._4_4_ = style;
  pFStack_30 = containing_file;
  containing_file_local = (FileDescriptorProto *)options_location;
  options_location_local = (LocationRecorder *)options;
  options_local = (Message *)this;
  this_00 = Message::GetDescriptor(options);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"uninterpreted_option",&local_61);
  pFVar3 = Descriptor::FindFieldByName(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  reflection._7_1_ = 0;
  local_40 = pFVar3;
  if (pFVar3 == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x50e);
    reflection._7_1_ = 1;
    pLVar4 = internal::LogMessage::operator<<
                       (&local_b0,"CHECK failed: uninterpreted_option_field != NULL: ");
    pLVar4 = internal::LogMessage::operator<<
                       (pLVar4,"No field named \"uninterpreted_option\" in the Options proto.");
    internal::LogFinisher::operator=((LogFinisher *)((long)&reflection + 6),pLVar4);
  }
  if ((reflection._7_1_ & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_b0);
  }
  location.location_ =
       (Location *)
       (*(code *)options_location_local->parser_[1].syntax_identifier_._M_string_length)();
  parent = containing_file_local;
  iVar2 = FieldDescriptor::number(local_40);
  path2 = (*((location.location_)->super_Message).super_MessageLite._vptr_MessageLite[6])
                    (location.location_,options_location_local,local_40);
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)local_d0,(LocationRecorder *)parent,iVar2,path2);
  if ((uninterpreted_option_field._4_4_ == OPTION_STATEMENT) &&
     (bVar1 = Consume(this,"option"), !bVar1)) {
    this_local._7_1_ = 0;
    goto LAB_004be224;
  }
  plVar5 = (long *)(*(code *)options_location_local->parser_[1].syntax_identifier_._M_string_length)
                             ();
  f = (Message *)(**(code **)(*plVar5 + 600))(plVar5,options_location_local,local_40,0);
  this_01 = internal::down_cast<google::protobuf::UninterpretedOption*,google::protobuf::Message>(f)
  ;
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)&part_location.location_,(LocationRecorder *)local_d0,2);
  LocationRecorder::RecordLegacyLocation
            ((LocationRecorder *)&part_location.location_,&this_01->super_Message,OPTION_NAME);
  iVar2 = UninterpretedOption::name_size(this_01);
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)&part_location_1.location_,
             (LocationRecorder *)&part_location.location_,iVar2);
  bVar1 = ParseOptionNamePart(this,this_01,(LocationRecorder *)&part_location_1.location_,pFStack_30
                             );
  if (!bVar1) {
    this_local._7_1_ = 0;
  }
  LocationRecorder::~LocationRecorder((LocationRecorder *)&part_location_1.location_);
  while (bVar1 = !bVar1, !bVar1) {
    bVar1 = LookingAt(this,".");
    if (!bVar1) {
      bVar1 = false;
      break;
    }
    bVar1 = Consume(this,".");
    if (!bVar1) {
      this_local._7_1_ = 0;
      bVar1 = true;
      break;
    }
    iVar2 = UninterpretedOption::name_size(this_01);
    LocationRecorder::LocationRecorder
              ((LocationRecorder *)&value_location.location_,
               (LocationRecorder *)&part_location.location_,iVar2);
    bVar1 = ParseOptionNamePart(this,this_01,(LocationRecorder *)&value_location.location_,
                                pFStack_30);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    LocationRecorder::~LocationRecorder((LocationRecorder *)&value_location.location_);
  }
  LocationRecorder::~LocationRecorder((LocationRecorder *)&part_location.location_);
  if (bVar1) goto LAB_004be224;
  bVar1 = Consume(this,"=");
  if (!bVar1) {
    this_local._7_1_ = 0;
    goto LAB_004be224;
  }
  LocationRecorder::LocationRecorder((LocationRecorder *)local_120,(LocationRecorder *)local_d0);
  LocationRecorder::RecordLegacyLocation
            ((LocationRecorder *)local_120,&this_01->super_Message,OPTION_VALUE);
  local_121 = TryConsume(this,"-");
  pTVar6 = io::Tokenizer::current(this->input_);
  switch(pTVar6->type) {
  case TYPE_START:
    internal::LogMessage::LogMessage
              (&local_160,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x543);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_160,"Trying to read value before any tokens have been read.");
    internal::LogFinisher::operator=(&local_161,pLVar4);
    internal::LogMessage::~LogMessage(&local_160);
    this_local._7_1_ = 0;
    uninterpreted_option._4_4_ = 1;
    break;
  case TYPE_END:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_188,"Unexpected end of stream while parsing option value.",
               &local_189);
    AddError(this,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    this_local._7_1_ = 0;
    uninterpreted_option._4_4_ = 1;
    break;
  case TYPE_IDENTIFIER:
    LocationRecorder::AddPath((LocationRecorder *)local_120,3);
    if ((local_121 & 1) == 0) {
      std::__cxx11::string::string((string *)&value_1);
      bVar1 = ConsumeIdentifier(this,(string *)&value_1,"Expected identifier.");
      if (bVar1) {
        UninterpretedOption::set_identifier_value(this_01,(string *)&value_1);
        uninterpreted_option._4_4_ = 4;
      }
      else {
        this_local._7_1_ = 0;
        uninterpreted_option._4_4_ = 1;
      }
      std::__cxx11::string::~string((string *)&value_1);
joined_r0x004be061:
      if (uninterpreted_option._4_4_ == 4) goto switchD_004bdaac_default;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1b0,"Invalid \'-\' symbol before identifier.",
                 (allocator *)(value.field_2._M_local_buf + 0xf));
      AddError(this,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)(value.field_2._M_local_buf + 0xf));
      this_local._7_1_ = 0;
      uninterpreted_option._4_4_ = 1;
    }
    break;
  case TYPE_INTEGER:
    value_2 = (double)((ulong)(local_121 & 1) - 1 | 0x8000000000000000);
    bVar1 = ConsumeInteger64(this,(uint64)value_2,&max_value,"Expected integer.");
    if (bVar1) {
      if ((local_121 & 1) == 0) {
        LocationRecorder::AddPath((LocationRecorder *)local_120,4);
        UninterpretedOption::set_positive_int_value(this_01,max_value);
      }
      else {
        LocationRecorder::AddPath((LocationRecorder *)local_120,5);
        UninterpretedOption::set_negative_int_value(this_01,-max_value);
      }
      goto switchD_004bdaac_default;
    }
    this_local._7_1_ = 0;
    uninterpreted_option._4_4_ = 1;
    break;
  case TYPE_FLOAT:
    LocationRecorder::AddPath((LocationRecorder *)local_120,6);
    bVar1 = ConsumeNumber(this,&local_1f0,"Expected number.");
    if (bVar1) {
      if ((local_121 & 1) == 0) {
        local_328 = local_1f0;
      }
      else {
        local_328 = -local_1f0;
      }
      UninterpretedOption::set_double_value(this_01,local_328);
      goto switchD_004bdaac_default;
    }
    this_local._7_1_ = 0;
    uninterpreted_option._4_4_ = 1;
    break;
  case TYPE_STRING:
    LocationRecorder::AddPath((LocationRecorder *)local_120,7);
    if ((local_121 & 1) == 0) {
      std::__cxx11::string::string((string *)local_238);
      bVar1 = ConsumeString(this,(string *)local_238,"Expected string.");
      if (bVar1) {
        UninterpretedOption::set_string_value(this_01,(string *)local_238);
        uninterpreted_option._4_4_ = 4;
      }
      else {
        this_local._7_1_ = 0;
        uninterpreted_option._4_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_238);
      goto joined_r0x004be061;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_210,"Invalid \'-\' symbol before string.",
               (allocator *)(value_3.field_2._M_local_buf + 0xf));
    AddError(this,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator((allocator<char> *)(value_3.field_2._M_local_buf + 0xf));
    this_local._7_1_ = 0;
    uninterpreted_option._4_4_ = 1;
    break;
  case TYPE_SYMBOL:
    bVar1 = LookingAt(this,"{");
    if (bVar1) {
      LocationRecorder::AddPath((LocationRecorder *)local_120,8);
      value_00 = UninterpretedOption::mutable_aggregate_value_abi_cxx11_(this_01);
      bVar1 = ParseUninterpretedBlock(this,value_00);
      if (bVar1) goto switchD_004bdaac_default;
      this_local._7_1_ = 0;
      uninterpreted_option._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_258,"Expected option value.",&local_259);
      AddError(this,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      this_local._7_1_ = 0;
      uninterpreted_option._4_4_ = 1;
    }
    break;
  default:
switchD_004bdaac_default:
    uninterpreted_option._4_4_ = 0;
  }
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_120);
  if (uninterpreted_option._4_4_ == 0) {
    if ((uninterpreted_option_field._4_4_ != OPTION_STATEMENT) ||
       (bVar1 = ConsumeEndOfDeclaration(this,";",(LocationRecorder *)local_d0), bVar1)) {
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
LAB_004be224:
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_d0);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseOption(Message* options,
                         const LocationRecorder& options_location,
                         const FileDescriptorProto* containing_file,
                         OptionStyle style) {
  // Create an entry in the uninterpreted_option field.
  const FieldDescriptor* uninterpreted_option_field = options->GetDescriptor()->
      FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(uninterpreted_option_field != NULL)
      << "No field named \"uninterpreted_option\" in the Options proto.";

  const Reflection* reflection = options->GetReflection();

  LocationRecorder location(
      options_location, uninterpreted_option_field->number(),
      reflection->FieldSize(*options, uninterpreted_option_field));

  if (style == OPTION_STATEMENT) {
    DO(Consume("option"));
  }

  UninterpretedOption* uninterpreted_option = down_cast<UninterpretedOption*>(
      options->GetReflection()->AddMessage(options,
                                           uninterpreted_option_field));

  // Parse dot-separated name.
  {
    LocationRecorder name_location(location,
                                   UninterpretedOption::kNameFieldNumber);
    name_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_NAME);

    {
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location,
                             containing_file));
    }

    while (LookingAt(".")) {
      DO(Consume("."));
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location,
                             containing_file));
    }
  }

  DO(Consume("="));

  {
    LocationRecorder value_location(location);
    value_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_VALUE);

    // All values are a single token, except for negative numbers, which consist
    // of a single '-' symbol, followed by a positive number.
    bool is_negative = TryConsume("-");

    switch (input_->current().type) {
      case io::Tokenizer::TYPE_START:
        GOOGLE_LOG(FATAL) << "Trying to read value before any tokens have been read.";
        return false;

      case io::Tokenizer::TYPE_END:
        AddError("Unexpected end of stream while parsing option value.");
        return false;

      case io::Tokenizer::TYPE_IDENTIFIER: {
        value_location.AddPath(
            UninterpretedOption::kIdentifierValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before identifier.");
          return false;
        }
        string value;
        DO(ConsumeIdentifier(&value, "Expected identifier."));
        uninterpreted_option->set_identifier_value(value);
        break;
      }

      case io::Tokenizer::TYPE_INTEGER: {
        uint64 value;
        uint64 max_value =
            is_negative ? static_cast<uint64>(kint64max) + 1 : kuint64max;
        DO(ConsumeInteger64(max_value, &value, "Expected integer."));
        if (is_negative) {
          value_location.AddPath(
              UninterpretedOption::kNegativeIntValueFieldNumber);
          uninterpreted_option->set_negative_int_value(
              -static_cast<int64>(value));
        } else {
          value_location.AddPath(
              UninterpretedOption::kPositiveIntValueFieldNumber);
          uninterpreted_option->set_positive_int_value(value);
        }
        break;
      }

      case io::Tokenizer::TYPE_FLOAT: {
        value_location.AddPath(UninterpretedOption::kDoubleValueFieldNumber);
        double value;
        DO(ConsumeNumber(&value, "Expected number."));
        uninterpreted_option->set_double_value(is_negative ? -value : value);
        break;
      }

      case io::Tokenizer::TYPE_STRING: {
        value_location.AddPath(UninterpretedOption::kStringValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before string.");
          return false;
        }
        string value;
        DO(ConsumeString(&value, "Expected string."));
        uninterpreted_option->set_string_value(value);
        break;
      }

      case io::Tokenizer::TYPE_SYMBOL:
        if (LookingAt("{")) {
          value_location.AddPath(
              UninterpretedOption::kAggregateValueFieldNumber);
          DO(ParseUninterpretedBlock(
              uninterpreted_option->mutable_aggregate_value()));
        } else {
          AddError("Expected option value.");
          return false;
        }
        break;
    }
  }

  if (style == OPTION_STATEMENT) {
    DO(ConsumeEndOfDeclaration(";", &location));
  }

  return true;
}